

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,string *stampDir)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string mod;
  string line;
  long *local_98;
  pointer local_90;
  long local_88 [2];
  string local_78;
  string *local_58;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar4 = false;
  local_58 = stampDir;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  do {
    do {
      while( true ) {
        do {
          do {
            bVar2 = cmsys::SystemTools::GetLineFromStream
                              (fin,&local_50,(bool *)0x0,0xffffffffffffffff);
            if (!bVar2) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,
                                CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                         local_50.field_2._M_local_buf[0]) + 1);
              }
              return;
            }
          } while (local_50._M_string_length == 0);
          cVar1 = *local_50._M_dataplus._M_p;
        } while ((cVar1 == '\r') || (cVar1 == '#'));
        if (cVar1 == ' ') break;
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        bVar4 = iVar3 == 0;
      }
    } while (!bVar4);
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    local_78._M_dataplus._M_p = local_90;
    local_78._M_string_length = (size_type)local_98;
    if (local_90 < (pointer)0x4) {
LAB_004a1c4b:
      local_78._M_dataplus._M_p = local_90;
      local_78._M_string_length = (size_type)local_98;
      if ((pointer)0x4 < local_90) {
        __str_00._M_str = ".smod";
        __str_00._M_len = 5;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_78,
                           (size_type)(local_90 + -5),5,__str_00);
        if (iVar3 == 0) goto LAB_004a1cd2;
      }
      local_78._M_dataplus._M_p = local_90;
      local_78._M_string_length = (size_type)local_98;
      if ((pointer)0x3 < local_90) {
        __str_01._M_str = ".sub";
        __str_01._M_len = 4;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_78,
                           (size_type)(local_90 + -4),4,__str_01);
        if (iVar3 == 0) goto LAB_004a1cd2;
      }
      std::__cxx11::string::append((char *)&local_98);
    }
    else {
      __str._M_str = ".mod";
      __str._M_len = 4;
      iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_78,
                         (size_type)(local_90 + -4),4,__str);
      if (iVar3 != 0) goto LAB_004a1c4b;
    }
LAB_004a1cd2:
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_98);
    ConsiderModule(this,&local_78,local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  } while( true );
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const std::string& stampDir)
{
  std::string line;
  bool doing_provides = false;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Ignore comments and empty lines.
    if (line.empty() || line[0] == '#' || line[0] == '\r') {
      continue;
    }

    if (line[0] == ' ') {
      if (doing_provides) {
        std::string mod = line;
        if (!cmHasLiteralSuffix(mod, ".mod") &&
            !cmHasLiteralSuffix(mod, ".smod") &&
            !cmHasLiteralSuffix(mod, ".sub")) {
          // Support fortran.internal files left by older versions of CMake.
          // They do not include the ".mod" extension.
          mod += ".mod";
        }
        this->ConsiderModule(mod.substr(1), stampDir);
      }
    } else if (line == "provides") {
      doing_provides = true;
    } else {
      doing_provides = false;
    }
  }
}